

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::GlobalObject::HasPropertyQuery(GlobalObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  RecyclableObject **ppRVar3;
  HostObjectBase **ppHVar4;
  bool local_31;
  bool local_21;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  PVar1 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
  BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
  local_21 = true;
  if (BVar2 == 0) {
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    if (*ppRVar3 != (RecyclableObject *)0x0) {
      ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                          ((WriteBarrierPtr *)&this->directHostObject);
      BVar2 = Js::JavascriptOperators::HasProperty(*ppRVar3,propertyId);
      local_21 = true;
      if (BVar2 != 0) goto LAB_01090383;
    }
    ppHVar4 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    local_31 = false;
    if (*ppHVar4 != (HostObjectBase *)0x0) {
      ppHVar4 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      BVar2 = Js::JavascriptOperators::HasProperty((RecyclableObject *)*ppHVar4,propertyId);
      local_31 = BVar2 != 0;
    }
    local_21 = local_31;
  }
LAB_01090383:
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags((uint)local_21);
  return PVar1;
}

Assistant:

PropertyQueryFlags GlobalObject::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        return JavascriptConversion::BooleanToPropertyQueryFlags(JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info)) ||
            (this->directHostObject && JavascriptOperators::HasProperty(this->directHostObject, propertyId)) ||
            (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId)));
    }